

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_negx_32_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint value;
  
  uVar1 = m68ki_read_imm_16();
  uVar2 = m68ki_read_32_fc((int)(short)uVar1,m68ki_address_space | m68ki_cpu.s_flag);
  value = ((int)(m68ki_cpu.x_flag << 0x17) >> 0x1f) - uVar2;
  m68ki_cpu.n_flag = value >> 0x18;
  m68ki_cpu.x_flag = (uVar2 | value) >> 0x17;
  m68ki_cpu.v_flag = (value & uVar2) >> 0x18;
  m68ki_cpu.not_z_flag = m68ki_cpu.not_z_flag | value;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_write_32_fc((int)(short)uVar1,m68ki_cpu.s_flag | 1,value);
  return;
}

Assistant:

static void m68k_op_negx_32_aw(void)
{
	uint ea  = EA_AW_32();
	uint src = m68ki_read_32(ea);
	uint res = 0 - MASK_OUT_ABOVE_32(src) - XFLAG_AS_1();

	FLAG_N = NFLAG_32(res);
	FLAG_X = FLAG_C = CFLAG_SUB_32(src, 0, res);
	FLAG_V = (src & res)>>24;

	res = MASK_OUT_ABOVE_32(res);
	FLAG_Z |= res;

	m68ki_write_32(ea, res);
}